

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O1

void __thiscall
chaiscript::Boxed_Value::Boxed_Value<chaiscript::dispatch::Dynamic_Object,void>
          (Boxed_Value *this,Dynamic_Object *t,bool t_return_value)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Base_ptr p_Var4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  *pmVar5;
  Dynamic_Object local_80;
  
  paVar2 = &local_80.m_type_name.field_2;
  pcVar3 = (t->m_type_name)._M_dataplus._M_p;
  local_80.m_type_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar3,pcVar3 + (t->m_type_name)._M_string_length);
  local_80.m_option_explicit = t->m_option_explicit;
  local_80.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header;
  local_80.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (t->m_attrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (local_80.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    pmVar5 = &local_80.m_attrs;
    local_80.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_80.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_80.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_80.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    p_Var1 = &(t->m_attrs)._M_t._M_impl.super__Rb_tree_header;
    local_80.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         (t->m_attrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    p_Var4 = (t->m_attrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_80.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (t->m_attrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_80.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         local_80.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pmVar5 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
              *)&(t->m_attrs)._M_t._M_impl;
    local_80.m_attrs._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (t->m_attrs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    (t->m_attrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (t->m_attrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (t->m_attrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    local_80.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var4;
  }
  *(size_t *)((long)&(pmVar5->_M_t)._M_impl.super__Rb_tree_header + 0x20) = 0;
  Object_Data::get<chaiscript::dispatch::Dynamic_Object>
            ((Object_Data *)this,&local_80,t_return_value);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~_Rb_tree(&local_80.m_attrs._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_type_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.m_type_name._M_dataplus._M_p,
                    local_80.m_type_name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

explicit Boxed_Value(T &&t, bool t_return_value = false)
        : m_data(Object_Data::get(std::forward<T>(t), t_return_value)) {
    }